

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_cases.h
# Opt level: O3

bool date::cases_reader_t<2ul,2ul>::
     read<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,date::branch_t<date::aliases_t<char,4ul,short,11ul>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::unsigned_integer_t<short,2u,2u>>>
               (iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos,
               iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end,
               cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
               *fmt)

{
  istreambuf_iterator<char,_std::char_traits<char>_> *piVar1;
  istreambuf_iterator<char,_std::char_traits<char>_> *piVar2;
  value_type *pvVar3;
  size_t *psVar4;
  size_t sVar5;
  istreambuf_iterator<char,_std::char_traits<char>_> *piVar6;
  bool bVar7;
  
  piVar1 = pos->m_srcIt;
  piVar2 = pos->m_srcEnd;
  pvVar3 = pos->m_cache;
  psVar4 = pos->m_cacheSize;
  sVar5 = pos->m_position;
  bVar7 = read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,char,4ul,short,11ul>
                    (pos,end,(aliases_t<char,_4UL,_short,_11UL> *)
                             &(fmt->branches).
                              super__Tuple_impl<0UL,_date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
                              .
                              super__Head_base<0UL,_date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_false>
                    );
  if (bVar7) {
    return true;
  }
  piVar6 = pos->m_srcIt;
  piVar6->_M_c = piVar1->_M_c;
  piVar6->_M_sbuf = piVar1->_M_sbuf;
  piVar1 = pos->m_srcEnd;
  piVar1->_M_c = piVar2->_M_c;
  piVar1->_M_sbuf = piVar2->_M_sbuf;
  pos->m_cache = pvVar3;
  *pos->m_cacheSize = *psVar4;
  pos->m_position = sVar5;
  bVar7 = cases_reader_t<2ul,1ul>::
          read<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,date::branch_t<date::aliases_t<char,4ul,short,11ul>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::unsigned_integer_t<short,2u,2u>>>
                    (pos,end,fmt);
  return bVar7;
}

Assistant:

static bool read(Iterator& pos, const Iterator& end, cases_t<Branches...>& fmt)
    {
        Iterator begin = pos;
        if (read_impl(pos, end, std::get<Count - N>(fmt.branches)))
            return true;
        
        pos = std::move(begin);
        return cases_reader_t<Count, N - 1>::read(pos, end, fmt);
    }